

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  size_t count;
  uint ch;
  byte *pbVar4;
  byte *local_18;
  
  local_18 = s + 1;
  bVar2 = s[1];
  if (0x66 < bVar2) {
    if (bVar2 == 0x67) {
      if (s[2] != 't') goto LAB_00110613;
      if (s[3] != ';') goto LAB_00110668;
      *s = '>';
    }
    else {
      if (bVar2 != 0x6c) {
        if (bVar2 != 0x71) {
          return local_18;
        }
        if (s[2] != 'u') {
LAB_00110613:
          return s + 2;
        }
        if (s[3] != 'o') goto LAB_00110668;
        if (s[4] != 't') goto LAB_00110697;
        if (s[5] != ';') goto LAB_001106da;
        *s = '\"';
        goto LAB_0011065d;
      }
      if (s[2] != 't') goto LAB_00110613;
      if (s[3] != ';') goto LAB_00110668;
      *s = '<';
    }
    pbVar4 = s + 4;
    count = 3;
    goto LAB_00110739;
  }
  if (bVar2 != 0x23) {
    if (bVar2 != 0x61) {
      return local_18;
    }
    if (s[2] != 'p') {
      if (s[2] != 'm') goto LAB_00110613;
      if (s[3] != 'p') goto LAB_00110668;
      if (s[4] != ';') goto LAB_00110697;
      *s = '&';
      pbVar4 = s + 5;
      count = 4;
      goto LAB_00110739;
    }
    if (s[3] != 'o') {
LAB_00110668:
      return s + 3;
    }
    if (s[4] != 's') {
LAB_00110697:
      return s + 4;
    }
    if (s[5] != ';') {
LAB_001106da:
      return s + 5;
    }
    *s = '\'';
LAB_0011065d:
    pbVar4 = s + 6;
    count = 5;
    goto LAB_00110739;
  }
  pbVar4 = s + 2;
  bVar2 = s[2];
  if (bVar2 != 0x3b) {
    if (bVar2 != 0x78) {
      ch = 0;
      while (bVar2 - 0x30 < 10) {
        ch = (bVar2 - 0x30) + ch * 10;
        pbVar1 = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
        bVar2 = *pbVar1;
      }
      if (bVar2 == 0x3b) {
        pbVar4 = pbVar4 + 1;
        goto LAB_001106d6;
      }
      goto LAB_001106e6;
    }
    bVar2 = s[3];
    if (bVar2 != 0x3b) {
      pbVar4 = s + 4;
      ch = 0;
      do {
        if (bVar2 - 0x30 < 10) {
          ch = ch << 4 | bVar2 - 0x30;
        }
        else {
          if (5 < (bVar2 | 0x20) - 0x61) goto LAB_001106d1;
          ch = ch * 0x10 + -0x57 + (bVar2 | 0x20);
        }
        bVar2 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      } while( true );
    }
    pbVar4 = s + 3;
  }
  ch = 0;
LAB_001106e6:
  bVar3 = false;
  goto LAB_001106e8;
LAB_001106d1:
  if (bVar2 != 0x3b) {
    pbVar4 = pbVar4 + -1;
    goto LAB_001106e6;
  }
LAB_001106d6:
  bVar3 = true;
LAB_001106e8:
  if (!bVar3) {
    return pbVar4;
  }
  if (ch < 0x10000) {
    local_18 = s;
    local_18 = utf8_writer::low(s,ch);
  }
  else {
    *s = (byte)(ch >> 0x12) | 0xf0;
    s[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
    s[2] = (byte)(ch >> 6) & 0x3f | 0x80;
    s[3] = (byte)ch & 0x3f | 0x80;
    local_18 = s + 4;
  }
  count = (long)pbVar4 - (long)local_18;
LAB_00110739:
  gap::push(g,&local_18,count);
  return pbVar4;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}